

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa_minimization.cpp
# Opt level: O0

void __thiscall wasm::DFA::anon_unknown_0::Partitions::Partitions(Partitions *this,size_t size)

{
  size_t sVar1;
  allocator<unsigned_long> local_31;
  allocator<unsigned_long> local_30;
  allocator<unsigned_long> local_2f;
  allocator<unsigned_long> local_2e;
  allocator<unsigned_long> local_2d [20];
  allocator<unsigned_long> local_19;
  size_t local_18;
  size_t size_local;
  Partitions *this_local;
  
  this->sets = 0;
  local_18 = size;
  size_local = (size_t)this;
  std::allocator<unsigned_long>::allocator(&local_19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->elements,size,&local_19)
  ;
  std::allocator<unsigned_long>::~allocator(&local_19);
  sVar1 = local_18;
  std::allocator<unsigned_long>::allocator(local_2d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->elementIndices,sVar1,local_2d);
  std::allocator<unsigned_long>::~allocator(local_2d);
  sVar1 = local_18;
  std::allocator<unsigned_long>::allocator(&local_2e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->setIndices,sVar1,&local_2e);
  std::allocator<unsigned_long>::~allocator(&local_2e);
  sVar1 = local_18;
  std::allocator<unsigned_long>::allocator(&local_2f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->beginnings,sVar1,&local_2f);
  std::allocator<unsigned_long>::~allocator(&local_2f);
  sVar1 = local_18;
  std::allocator<unsigned_long>::allocator(&local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->endings,sVar1,&local_30)
  ;
  std::allocator<unsigned_long>::~allocator(&local_30);
  sVar1 = local_18;
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->pivots,sVar1,&local_31);
  std::allocator<unsigned_long>::~allocator(&local_31);
  return;
}

Assistant:

Partitions(size_t size)
    : elements(size), elementIndices(size), setIndices(size), beginnings(size),
      endings(size), pivots(size) {}